

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_values.cc
# Opt level: O3

bool bssl::der::anon_unknown_3::DecimalStringToUint<unsigned_short>
               (ByteReader *in,size_t digits,unsigned_short *out)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  unsigned_short uVar4;
  uint8_t digit;
  byte local_39;
  unsigned_short *local_38;
  
  if (digits == 0) {
    uVar4 = 0;
LAB_004a8a12:
    *out = uVar4;
    bVar1 = true;
  }
  else {
    bVar1 = ByteReader::ReadByte(in,&local_39);
    if (bVar1) {
      uVar3 = 1;
      uVar4 = 0;
      bVar1 = false;
      local_38 = out;
      do {
        if ((byte)(local_39 - 0x3a) < 0xf6) {
          return bVar1;
        }
        uVar4 = ((ushort)local_39 + uVar4 * 10) - 0x30;
        out = local_38;
        if (digits == uVar3) goto LAB_004a8a12;
        bVar1 = digits <= uVar3;
        bVar2 = ByteReader::ReadByte(in,&local_39);
        uVar3 = uVar3 + 1;
      } while (bVar2);
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool DecimalStringToUint(ByteReader &in, size_t digits, UINT *out) {
  UINT value = 0;
  for (size_t i = 0; i < digits; ++i) {
    uint8_t digit;
    if (!in.ReadByte(&digit)) {
      return false;
    }
    if (digit < '0' || digit > '9') {
      return false;
    }
    value = (value * 10) + (digit - '0');
  }
  *out = value;
  return true;
}